

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O2

Complex __thiscall rtb::Filter::Filter<double>::feedbackCoefficientsProduct(Filter<double> *this)

{
  ulong uVar1;
  const_reference __x;
  undefined8 in_RDX;
  ulong uVar2;
  double dVar3;
  double extraout_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double dVar4;
  complex<double> cVar5;
  Complex CVar6;
  undefined1 local_40 [16];
  
  dVar4 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  uVar2 = 1;
  dVar3 = 0.0;
  while( true ) {
    uVar1 = this->n_;
    CVar6._M_value._0_8_ = uVar1 - uVar2;
    if (uVar1 < uVar2 || CVar6._M_value._0_8_ == 0) break;
    __x = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                    (&this->y_,(CVar6._M_value._0_8_ + this->count_) % uVar1);
    Polynomial<double>::getCoefficient(&(this->tf_).denominator_,(uint)uVar2);
    local_40._8_8_ = dVar4;
    cVar5 = std::operator*(__x,(complex<double> *)local_40);
    in_RDX = cVar5._M_value._8_8_;
    dVar4 = dVar3 + extraout_XMM0_Qa;
    uVar2 = (ulong)((uint)uVar2 + 1);
    dVar3 = dVar4;
  }
  CVar6._M_value._8_8_ = in_RDX;
  return (Complex)CVar6._M_value;
}

Assistant:

typename Filter<T>::Complex Filter<T>::feedbackCoefficientsProduct() const {

            Complex result{ 0 };
            for (unsigned k{ 1 }; k < n_; ++k)
                result += y_.at((n_ - k + count_) % n_)*tf_.a(k);
            return -result;
        }